

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

void __thiscall
libtorrent::resolver::on_lookup
          (resolver *this,error_code *ec,iterator *i,callback_t *h,string *hostname)

{
  string *h_00;
  iterator *ec_00;
  bool bVar1;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *this_00;
  basic_resolver_entry<boost::asio::ip::tcp> *this_01;
  size_type sVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  local_d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  local_d0;
  iterator k;
  iterator oldest;
  address local_a0;
  basic_resolver_iterator<boost::asio::ip::tcp> local_80;
  duration local_68;
  mapped_type *local_60;
  dns_cache_entry *ce;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_48;
  key_type *local_30;
  string *hostname_local;
  callback_t *h_local;
  iterator *i_local;
  error_code *ec_local;
  resolver *this_local;
  
  local_30 = hostname;
  hostname_local = (string *)h;
  h_local = (callback_t *)i;
  i_local = (iterator *)ec;
  ec_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  ec_00 = i_local;
  h_00 = hostname_local;
  if (bVar1) {
    local_48.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              (&local_48);
    callback(this,(callback_t *)h_00,(error_code *)ec_00,&local_48);
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::~vector
              (&local_48);
  }
  else {
    local_60 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
               ::operator[](&this->m_cache,local_30);
    local_68.__r = (rep)libtorrent::aux::time_now();
    (local_60->last_seen).__d.__r = local_68.__r;
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::clear
              (&local_60->addresses);
    while( true ) {
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
                (&local_80);
      bVar1 = boost::asio::ip::operator!=(i,&local_80);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
                (&local_80);
      if (!bVar1) break;
      this_00 = &local_60->addresses;
      this_01 = boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator->(i);
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::endpoint
                ((endpoint_type *)
                 ((long)&oldest.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                         ._M_cur + 4),this_01);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_a0,
                 (basic_endpoint<boost::asio::ip::tcp> *)
                 ((long)&oldest.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                         ._M_cur + 4));
      std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::push_back
                (this_00,&local_a0);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator++(i);
    }
    callback(this,(callback_t *)hostname_local,(error_code *)i_local,&local_60->addresses);
    sVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
            ::size(&this->m_cache);
    if (this->m_max_size < (int)sVar2) {
      k = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
          ::begin(&this->m_cache);
      local_d0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
           ::begin(&this->m_cache);
      while( true ) {
        local_d8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
             ::end(&this->m_cache);
        bVar1 = std::__detail::operator!=(&local_d0,&local_d8);
        if (!bVar1) break;
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                               *)&local_d0);
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                 ::operator->(&k);
        bVar1 = std::chrono::operator<(&(ppVar3->second).last_seen,&(ppVar4->second).last_seen);
        if (bVar1) {
          k.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
          ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                     )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                       )local_d0._M_cur;
        }
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_false,_true>
                      *)&local_d0);
      }
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>_>
      ::erase(&this->m_cache,k);
    }
  }
  return;
}

Assistant:

void resolver::on_lookup(error_code const& ec, tcp::resolver::iterator i
		, resolver_interface::callback_t const& h, std::string const& hostname)
	{
		COMPLETE_ASYNC("resolver::on_lookup");
		if (ec)
		{
			callback(h, ec, {});
			return;
		}

		dns_cache_entry& ce = m_cache[hostname];
		ce.last_seen = aux::time_now();
		ce.addresses.clear();
		while (i != tcp::resolver::iterator())
		{
			ce.addresses.push_back(i->endpoint().address());
			++i;
		}

		callback(h, ec, ce.addresses);

		// if m_cache grows too big, weed out the
		// oldest entries
		if (int(m_cache.size()) > m_max_size)
		{
			auto oldest = m_cache.begin();
			for (auto k = m_cache.begin(); k != m_cache.end(); ++k)
			{
				if (k->second.last_seen < oldest->second.last_seen)
					oldest = k;
			}

			// remove the oldest entry
			m_cache.erase(oldest);
		}
	}